

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-info.cpp
# Opt level: O0

FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor> * __thiscall
FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor>::file_info
          (FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor> *this,CommandOptions *Options
          ,char *type_string,FILE *stream)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  FILE *in_R8;
  char *pcVar5;
  undefined1 local_140 [128];
  string local_c0 [32];
  string local_a0 [111];
  undefined1 local_31;
  FILE *local_30;
  FILE *stream_local;
  char *type_string_local;
  CommandOptions *Options_local;
  FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor> *this_local;
  Result_t *result;
  
  stream_local = stream;
  type_string_local = type_string;
  Options_local = Options;
  this_local = this;
  if (stream == (FILE *)0x0) {
    __assert_fail("type_string",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-info.cpp"
                  ,0x13e,
                  "Result_t FileInfoWrapper<ASDCP::ATMOS::MXFReader, MyAtmosDescriptor>::file_info(CommandOptions &, const char *, FILE *) [ReaderT = ASDCP::ATMOS::MXFReader, DescriptorT = MyAtmosDescriptor]"
                 );
  }
  local_30 = in_R8;
  if (in_R8 == (FILE *)0x0) {
    local_30 = _stdout;
  }
  local_31 = 0;
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(type_string_local + 8));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,pcVar4,(allocator<char> *)(local_140 + 0x7f));
  ASDCP::ATMOS::MXFReader::OpenRead(local_a0);
  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_a0);
  Kumu::Result_t::~Result_t((Result_t *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(local_140 + 0x7f));
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (iVar3 < 0) {
    bVar2 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
    if ((bVar2) && ((type_string_local[0x21] & 1U) != 0)) {
      ASDCP::ATMOS::MXFReader::DumpHeaderMetadata((_IO_FILE *)&Options->filenames);
    }
  }
  else {
    MyAtmosDescriptor::FillDescriptor
              ((MyAtmosDescriptor *)
               &(Options->filenames).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size,(MXFReader *)&Options->filenames);
    ASDCP::ATMOS::MXFReader::FillWriterInfo((WriterInfo *)local_140);
    Kumu::Result_t::~Result_t((Result_t *)local_140);
    pcVar4 = "Interop";
    if ((int)Options[5].filenames.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node._M_size == 2) {
      pcVar4 = "SMPTE 429";
    }
    uVar1._0_1_ = Options->showindex_flag;
    uVar1._1_1_ = Options->showheader_flag;
    uVar1._2_1_ = Options->stereo_image_flag;
    uVar1._3_1_ = Options->showid_flag;
    iVar3._0_1_ = Options->showindex_flag;
    iVar3._1_1_ = Options->showheader_flag;
    iVar3._2_1_ = Options->stereo_image_flag;
    iVar3._3_1_ = Options->showid_flag;
    pcVar5 = "s";
    if (iVar3 == 1) {
      pcVar5 = "";
    }
    fprintf(_stdout,"%s file essence type is %s, (%d edit unit%s).\n",pcVar4,stream_local,
            (ulong)uVar1,pcVar5);
    if ((type_string_local[0x21] & 1U) != 0) {
      ASDCP::ATMOS::MXFReader::DumpHeaderMetadata((_IO_FILE *)&Options->filenames);
    }
    if ((type_string_local[0x23] & 1U) != 0) {
      ASDCP::WriterInfoDump((WriterInfo *)(Options + 2),local_30);
    }
    if ((type_string_local[0x24] & 1U) != 0) {
      MyAtmosDescriptor::Dump
                ((MyAtmosDescriptor *)
                 &(Options->filenames).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size,(FILE *)local_30);
    }
    if ((type_string_local[0x20] & 1U) != 0) {
      ASDCP::ATMOS::MXFReader::DumpIndex((_IO_FILE *)&Options->filenames);
    }
  }
  return this;
}

Assistant:

Result_t
  file_info(CommandOptions& Options, const char* type_string, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;
    result = m_Reader.OpenRead(Options.filenames.front().c_str());

    if ( ASDCP_SUCCESS(result) )
      {
	m_Desc.FillDescriptor(m_Reader);
	m_Reader.FillWriterInfo(m_WriterInfo);

	fprintf(stdout, "%s file essence type is %s, (%d edit unit%s).\n",
		( m_WriterInfo.LabelSetType == LS_MXF_SMPTE ? "SMPTE 429" : LS_MXF_INTEROP ? "Interop" : "Unknown" ),
		type_string, m_Desc.ContainerDuration, (m_Desc.ContainerDuration==1?"":"s"));

	if ( Options.showheader_flag )
	  m_Reader.DumpHeaderMetadata(stream);

	if ( Options.showid_flag )
	  WriterInfoDump(m_WriterInfo, stream);

	if ( Options.showdescriptor_flag )
	  m_Desc.Dump(stream);

	if ( Options.showindex_flag )
	  m_Reader.DumpIndex(stream);
      }
    else if ( result == RESULT_FORMAT && Options.showheader_flag )
      {
	m_Reader.DumpHeaderMetadata(stream);
      }

    return result;
  }